

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDescriptorPoolTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::outOfPoolMemoryTest(TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  pointer pbVar2;
  bool bVar3;
  VkResult value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  char *pcVar5;
  size_t sVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  TestLog *pTVar10;
  long *plVar11;
  VkDescriptorType value_00;
  VkDescriptorPoolSize descriptorPoolSize;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  rawSetLayouts;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  descriptorSetLayoutBindings;
  vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
  rawDescriptorSets;
  VkDescriptorSetLayoutBinding descriptorSetLayoutBinding;
  VkDescriptorSetLayoutCreateInfo descriptorSetLayoutInfo;
  VkDescriptorPoolCreateInfo descriptorPoolCreateInfo;
  VkDescriptorSetAllocateInfo descriptorSetAllocateInfo;
  allocator<char> local_471;
  TestStatus *local_470;
  int local_464;
  Context *local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_458;
  string *local_450;
  DeviceInterface *local_448;
  VkDevice local_440;
  long *local_438;
  long local_430;
  long local_428;
  long lStack_420;
  VkDescriptorPoolSize local_418;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_> local_410
  ;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  local_3f8;
  long local_3e0;
  pointer local_3d8;
  pointer local_3d0;
  vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_> local_3c8
  ;
  value_type local_3b0;
  long *local_398 [2];
  long local_388 [2];
  value_type local_378;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_370;
  VkDescriptorPool local_358;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_350;
  VkDescriptorSetLayoutCreateInfo local_338;
  VkDescriptorPoolCreateInfo local_318;
  undefined1 local_2f0 [16];
  TestLog local_2e0 [13];
  ios_base local_278 [264];
  undefined4 local_170 [2];
  undefined8 local_168;
  TestLog *local_160;
  undefined4 local_158;
  pointer local_150;
  deUint32 local_148 [2];
  uint auStack_140 [2];
  deUint32 local_138 [2];
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_470 = __return_storage_ptr__;
  local_448 = Context::getDeviceInterface(context);
  local_440 = Context::getDevice(context);
  pvVar4 = Context::getDeviceExtensions_abi_cxx11_(context);
  pbVar2 = (pvVar4->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_460 = context;
  pvVar4 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_3d0 = (pvVar4->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_3d8 = (pointer)std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                                 (pbVar2,local_3d0,"VK_KHR_maintenance1");
  local_148[0] = 4;
  local_148[1] = 2;
  auStack_140[0] = 1;
  auStack_140[1] = 1;
  local_138[0] = 3;
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Out of descriptor sets","");
  local_110 = 3;
  uStack_10c = 4;
  uStack_108 = 1;
  uStack_104 = 1;
  local_100 = 4;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"Out of descriptors (due to the number of sets)","");
  local_d8 = 2;
  uStack_d4 = 1;
  uStack_d0 = 3;
  uStack_cc = 1;
  local_c8 = 1;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"Out of descriptors (due to the number of bindings)","");
  local_a0 = 3;
  uStack_9c = 2;
  uStack_98 = 1;
  uStack_94 = 2;
  local_90 = 2;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"Out of descriptors (due to descriptor array size)","");
  local_68 = 5;
  uStack_64 = 1;
  uStack_60 = 2;
  uStack_5c = 3;
  local_58 = 1;
  plVar11 = local_40;
  local_50[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Out of descriptors (due to descriptor array size in all bindings)",
             "");
  local_2f0._0_8_ = local_460->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_2f0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Creating a descriptor pool with insufficient resources. Descriptor set allocation is likely to fail."
             ,100);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_278);
  poVar1 = (ostringstream *)(local_2f0 + 8);
  local_450 = (string *)&local_470->m_description;
  local_458 = &(local_470->m_description).field_2;
  lVar8 = 0;
  local_464 = 0;
  do {
    local_2f0._0_8_ = local_460->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Checking: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(&local_130)[lVar8 * 7],(&local_128)[lVar8 * 7]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_3e0 = lVar8;
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_278);
    value_00 = VK_DESCRIPTOR_TYPE_SAMPLER;
    do {
      local_2f0._0_8_ = local_460->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"- ",2);
      pcVar5 = ::vk::getDescriptorTypeName(value_00);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar1 +
                        (int)((DeviceInterface *)(local_2f0._8_8_ + -0x18))->_vptr_DeviceInterface);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar5,sVar6);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_278);
      local_418.descriptorCount = local_148[lVar8 * 0xe];
      local_318.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
      local_318.pNext = (void *)0x0;
      local_318.flags = 0;
      local_318.maxSets = local_148[lVar8 * 0xe + 1];
      local_318.poolSizeCount = 1;
      local_318.pPoolSizes = &local_418;
      local_418.type = value_00;
      ::vk::createDescriptorPool
                ((Move<vk::Handle<(vk::HandleType)21>_> *)local_2f0,local_448,local_440,&local_318,
                 (VkAllocationCallbacks *)0x0);
      DStack_350.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(local_2e0[1].m_log._4_4_,local_2e0[1].m_log._0_4_);
      DStack_350.m_device = (VkDevice)local_2e0[0].m_log;
      local_358.m_internal = local_2f0._0_8_;
      DStack_350.m_deviceIface = (DeviceInterface *)local_2f0._8_8_;
      local_3b0.binding = 0;
      local_3b0.descriptorCount = local_138[lVar8 * 0xe + -1];
      local_3b0.stageFlags = 0x7fffffff;
      local_3b0.pImmutableSamplers = (VkSampler *)0x0;
      local_3b0.descriptorType = value_00;
      std::
      vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
      vector(&local_3f8,(ulong)auStack_140[lVar8 * 0xe],&local_3b0,(allocator_type *)local_2f0);
      local_338.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
      local_338.pNext = (void *)0x0;
      local_338.flags = 0;
      local_338.bindingCount =
           (int)((ulong)((long)local_3f8.
                               super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_3f8.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      local_338.pBindings =
           local_3f8.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
      ::vk::createDescriptorSetLayout
                ((Move<vk::Handle<(vk::HandleType)19>_> *)local_2f0,local_448,local_440,&local_338,
                 (VkAllocationCallbacks *)0x0);
      DStack_370.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(local_2e0[1].m_log._4_4_,local_2e0[1].m_log._0_4_);
      DStack_370.m_device = (VkDevice)local_2e0[0].m_log;
      local_378.m_internal = local_2f0._0_8_;
      DStack_370.m_deviceIface = (DeviceInterface *)local_2f0._8_8_;
      std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ::vector(&local_410,(ulong)local_138[lVar8 * 0xe],&local_378,(allocator_type *)local_2f0);
      local_2f0._0_8_ = (TestLog *)0x0;
      std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
      ::vector(&local_3c8,(ulong)local_138[lVar8 * 0xe],(value_type *)local_2f0,
               (allocator_type *)local_170);
      local_170[0] = 0x22;
      local_168 = 0;
      local_160 = (TestLog *)local_358.m_internal;
      local_158 = (undefined4)
                  ((ulong)((long)local_410.
                                 super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_410.
                                super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_150 = local_410.
                  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      value = (*local_448->_vptr_DeviceInterface[0x3c])
                        (local_448,local_440,(allocator_type *)local_170,
                         local_3c8.
                         super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (value == VK_SUCCESS) {
        local_2f0._0_8_ = local_460->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2f0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_2f0 + 8),"  Allocation was successful anyway",0x22);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_2f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2f0 + 8));
        std::ios_base::~ios_base(local_278);
        bVar3 = true;
      }
      else {
        local_464 = local_464 + 1;
        bVar3 = true;
        if ((local_3d8 != local_3d0) && (value != VK_ERROR_OUT_OF_POOL_MEMORY_KHR)) {
          pcVar5 = ::vk::getResultName(value);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_398,pcVar5,&local_471);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_398,0,(char *)0x0,0xaac18a);
          local_438 = &local_428;
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            local_428 = *plVar9;
            lStack_420 = plVar7[3];
          }
          else {
            local_428 = *plVar9;
            local_438 = (long *)*plVar7;
          }
          local_430 = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_438);
          local_2f0._0_8_ = local_2e0;
          pTVar10 = (TestLog *)(plVar7 + 2);
          if ((TestLog *)*plVar7 == pTVar10) {
            local_2e0[0].m_log = pTVar10->m_log;
            local_2e0[1].m_log._0_4_ = *(undefined4 *)(plVar7 + 3);
            local_2e0[1].m_log._4_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
          }
          else {
            local_2e0[0].m_log = pTVar10->m_log;
            local_2f0._0_8_ = (TestLog *)*plVar7;
          }
          local_2f0._8_8_ = plVar7[1];
          *plVar7 = (long)pTVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          local_470->m_code = QP_TEST_RESULT_FAIL;
          (local_470->m_description)._M_dataplus._M_p = (pointer)local_458;
          std::__cxx11::string::_M_construct<char*>
                    (local_450,local_2f0._0_8_,
                     (long)(qpTestLog **)local_2f0._0_8_ +
                     (long)&((DeviceInterface *)local_2f0._8_8_)->_vptr_DeviceInterface);
          if ((TestLog *)local_2f0._0_8_ != local_2e0) {
            operator_delete((void *)local_2f0._0_8_,(ulong)((long)&(local_2e0[0].m_log)->flags + 1))
            ;
          }
          if (local_438 != &local_428) {
            operator_delete(local_438,local_428 + 1);
          }
          if (local_398[0] != local_388) {
            operator_delete(local_398[0],local_388[0] + 1);
          }
          bVar3 = false;
        }
      }
      if (local_3c8.
          super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3c8.
                        super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_3c8.
                              super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3c8.
                              super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_410.
          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_410.
                        super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_410.
                              super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_410.
                              super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_378.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&DStack_370,(VkDescriptorSetLayout)local_378.m_internal);
      }
      if (local_3f8.
          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3f8.
                        super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_3f8.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3f8.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_358.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  (&DStack_350,local_358);
      }
      if (!bVar3) goto LAB_0045be34;
      value_00 = value_00 + VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
    } while (value_00 != VK_DESCRIPTOR_TYPE_LAST);
    lVar8 = local_3e0 + 1;
  } while (lVar8 != 5);
  if (local_464 == 0) {
    local_2f0._0_8_ = local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"Not validated","");
    local_470->m_code = QP_TEST_RESULT_PASS;
    (local_470->m_description)._M_dataplus._M_p = (pointer)local_458;
    std::__cxx11::string::_M_construct<char*>
              (local_450,local_2f0._0_8_,
               (long)(qpTestLog **)local_2f0._0_8_ + (long)(_func_int ***)local_2f0._8_8_);
  }
  else {
    local_2f0._0_8_ = local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"Pass","");
    local_470->m_code = QP_TEST_RESULT_PASS;
    (local_470->m_description)._M_dataplus._M_p = (pointer)local_458;
    std::__cxx11::string::_M_construct<char*>
              (local_450,local_2f0._0_8_,
               (long)(qpTestLog **)local_2f0._0_8_ + (long)(_func_int ***)local_2f0._8_8_);
  }
  if ((TestLog *)local_2f0._0_8_ != local_2e0) {
    operator_delete((void *)local_2f0._0_8_,(ulong)((long)&(local_2e0[0].m_log)->flags + 1));
  }
LAB_0045be34:
  lVar8 = -0x118;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -7;
    lVar8 = lVar8 + 0x38;
  } while (lVar8 != 0);
  return local_470;
}

Assistant:

tcu::TestStatus outOfPoolMemoryTest (Context& context)
{
	const DeviceInterface&	vkd							= context.getDeviceInterface();
	const VkDevice			device						= context.getDevice();
	const bool				expectOutOfPoolMemoryError	= de::contains(context.getDeviceExtensions().begin(), context.getDeviceExtensions().end(), "VK_KHR_maintenance1");
	deUint32				numErrorsReturned			= 0;

	const struct FailureCase
	{
		deUint32	poolDescriptorCount;		//!< total number of descriptors (of a given type) in the descriptor pool
		deUint32	poolMaxSets;				//!< max number of descriptor sets that can be allocated from the pool
		deUint32	bindingCount;				//!< number of bindings per descriptor set layout
		deUint32	bindingDescriptorCount;		//!< number of descriptors in a binding (array size) (in all bindings)
		deUint32	descriptorSetCount;			//!< number of descriptor sets to allocate
		string		description;				//!< the log message for this failure condition
	} failureCases[] =
	{
		//	pool			pool		binding		binding		alloc set
		//	descr. count	max sets	count		array size	count
		{	4u,				2u,			1u,			1u,			3u,		"Out of descriptor sets",											},
		{	3u,				4u,			1u,			1u,			4u,		"Out of descriptors (due to the number of sets)",					},
		{	2u,				1u,			3u,			1u,			1u,		"Out of descriptors (due to the number of bindings)",				},
		{	3u,				2u,			1u,			2u,			2u,		"Out of descriptors (due to descriptor array size)",				},
		{	5u,				1u,			2u,			3u,			1u,		"Out of descriptors (due to descriptor array size in all bindings)",},
	};

	context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Creating a descriptor pool with insufficient resources. Descriptor set allocation is likely to fail."
		<< tcu::TestLog::EndMessage;

	for (deUint32 failureCaseNdx = 0u; failureCaseNdx < DE_LENGTH_OF_ARRAY(failureCases); ++failureCaseNdx)
	{
		const FailureCase& params = failureCases[failureCaseNdx];
		context.getTestContext().getLog() << tcu::TestLog::Message << "Checking: " << params.description << tcu::TestLog::EndMessage;

		for (VkDescriptorType	descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
								descriptorType < VK_DESCRIPTOR_TYPE_LAST;
								descriptorType = static_cast<VkDescriptorType>(descriptorType + 1))
		{
			context.getTestContext().getLog() << tcu::TestLog::Message << "- " << getDescriptorTypeName(descriptorType) << tcu::TestLog::EndMessage;

			const VkDescriptorPoolSize					descriptorPoolSize =
			{
				descriptorType,												// type
				params.poolDescriptorCount,									// descriptorCount
			};

			const VkDescriptorPoolCreateInfo			descriptorPoolCreateInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,				// VkStructureType                sType;
				DE_NULL,													// const void*                    pNext;
				(VkDescriptorPoolCreateFlags)0,								// VkDescriptorPoolCreateFlags    flags;
				params.poolMaxSets,											// uint32_t                       maxSets;
				1u,															// uint32_t                       poolSizeCount;
				&descriptorPoolSize,										// const VkDescriptorPoolSize*    pPoolSizes;
			};

			const Unique<VkDescriptorPool>				descriptorPool(createDescriptorPool(vkd, device, &descriptorPoolCreateInfo));

			const VkDescriptorSetLayoutBinding			descriptorSetLayoutBinding =
			{
				0u,															// uint32_t              binding;
				descriptorType,												// VkDescriptorType      descriptorType;
				params.bindingDescriptorCount,								// uint32_t              descriptorCount;
				VK_SHADER_STAGE_ALL,										// VkShaderStageFlags    stageFlags;
				DE_NULL,													// const VkSampler*      pImmutableSamplers;
			};

			const vector<VkDescriptorSetLayoutBinding>	descriptorSetLayoutBindings (params.bindingCount, descriptorSetLayoutBinding);
			const VkDescriptorSetLayoutCreateInfo		descriptorSetLayoutInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,		// VkStructureType                        sType;
				DE_NULL,													// const void*                            pNext;
				(VkDescriptorSetLayoutCreateFlags)0,						// VkDescriptorSetLayoutCreateFlags       flags;
				static_cast<deUint32>(descriptorSetLayoutBindings.size()),	// uint32_t                               bindingCount;
				&descriptorSetLayoutBindings[0],							// const VkDescriptorSetLayoutBinding*    pBindings;
			};

			const Unique<VkDescriptorSetLayout>			descriptorSetLayout	(createDescriptorSetLayout(vkd, device, &descriptorSetLayoutInfo));
			const vector<VkDescriptorSetLayout>			rawSetLayouts		(params.descriptorSetCount, *descriptorSetLayout);
			vector<VkDescriptorSet>						rawDescriptorSets	(params.descriptorSetCount, DE_NULL);

			const VkDescriptorSetAllocateInfo			descriptorSetAllocateInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,				// VkStructureType                 sType;
				DE_NULL,													// const void*                     pNext;
				*descriptorPool,											// VkDescriptorPool                descriptorPool;
				static_cast<deUint32>(rawSetLayouts.size()),				// uint32_t                        descriptorSetCount;
				&rawSetLayouts[0],											// const VkDescriptorSetLayout*    pSetLayouts;
			};

			const VkResult result = vkd.allocateDescriptorSets(device, &descriptorSetAllocateInfo, &rawDescriptorSets[0]);

			if (result != VK_SUCCESS)
			{
				++numErrorsReturned;

				if (expectOutOfPoolMemoryError && result != VK_ERROR_OUT_OF_POOL_MEMORY_KHR)
					return tcu::TestStatus::fail("Expected VK_ERROR_OUT_OF_POOL_MEMORY_KHR but got " + string(getResultName(result)) + " instead");
			}
			else
				context.getTestContext().getLog() << tcu::TestLog::Message << "  Allocation was successful anyway" << tcu::TestLog::EndMessage;
		}
	}

	if (numErrorsReturned == 0u)
		return tcu::TestStatus::pass("Not validated");
	else
		return tcu::TestStatus::pass("Pass");
}